

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O1

QRect __thiscall QAccessibleMdiSubWindow::rect(QAccessibleMdiSubWindow *this)

{
  long lVar1;
  QWidget *this_00;
  QPoint QVar2;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  QRect QVar5;
  QRect QVar6;
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))();
  if ((*(byte *)(*(long *)(lVar1 + 0x20) + 10) & 1) == 0) {
    lVar1 = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    if (*(long *)(*(long *)(lVar1 + 8) + 0x10) == 0) {
      QVar5 = QAccessibleWidget::rect(&this->super_QAccessibleWidget);
      uVar4 = QVar5._0_8_ >> 0x20;
      uVar3 = QVar5._8_8_ >> 0x20;
    }
    else {
      this_00 = (QWidget *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      local_28.xp.m_i = 0;
      local_28.yp.m_i = 0;
      QVar2 = QWidget::mapToGlobal(this_00,&local_28);
      uVar4 = (ulong)QVar2 >> 0x20;
      lVar1 = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      lVar1 = *(long *)(lVar1 + 0x20);
      QVar5.x2.m_i = (*(int *)(lVar1 + 0x1c) + QVar2.xp.m_i.m_i) - *(int *)(lVar1 + 0x14);
      QVar5.x1.m_i = QVar2.xp.m_i;
      QVar5.y1.m_i = QVar2.yp.m_i;
      QVar5.y2.m_i = 0;
      uVar3 = (ulong)(uint)((*(int *)(lVar1 + 0x20) + QVar2.yp.m_i.m_i) - *(int *)(lVar1 + 0x18));
    }
  }
  else {
    QVar5 = (QRect)(ZEXT816(0xffffffff) << 0x40);
    uVar4 = 0;
    uVar3 = 0xffffffff;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    QVar6._0_8_ = QVar5._0_8_ & 0xffffffff | uVar4 << 0x20;
    QVar6._8_8_ = QVar5._8_8_ & 0xffffffff | uVar3 << 0x20;
    return QVar6;
  }
  __stack_chk_fail();
}

Assistant:

QRect QAccessibleMdiSubWindow::rect() const
{
    if (mdiSubWindow()->isHidden())
        return QRect();
    if (!mdiSubWindow()->parent())
        return QAccessibleWidget::rect();
    const QPoint pos = mdiSubWindow()->mapToGlobal(QPoint(0, 0));
    return QRect(pos, mdiSubWindow()->size());
}